

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlAttribute * __thiscall TiXmlAttributeSet::FindOrCreate(TiXmlAttributeSet *this,char *_name)

{
  TiXmlAttribute *this_00;
  
  this_00 = Find(this,_name);
  if (this_00 == (TiXmlAttribute *)0x0) {
    this_00 = (TiXmlAttribute *)operator_new(0x40);
    TiXmlAttribute::TiXmlAttribute(this_00);
    Add(this,this_00);
    TiXmlString::operator=(&this_00->name,_name);
  }
  return this_00;
}

Assistant:

TiXmlAttribute* TiXmlAttributeSet::FindOrCreate( const char* _name )
{
	TiXmlAttribute* attrib = Find( _name );
	if ( !attrib ) {
		attrib = new TiXmlAttribute();
		Add( attrib );
		attrib->SetName( _name );
	}
	return attrib;
}